

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2NULTerminated(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  LogMessage local_8a8;
  LogMessage local_728;
  int *local_5a8;
  RE2 local_5a0;
  StringPiece local_4c0;
  LogMessage local_4b0;
  LogMessage local_330;
  LogMessage local_1a0;
  size_t local_20;
  long pagesize;
  void *pvStack_10;
  int x;
  char *v;
  
  local_20 = sysconf(0x1e);
  pvStack_10 = mmap((void *)0x0,local_20 << 1,3,0x22,-1,0);
  if (pvStack_10 == (void *)0xffffffffffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2e8);
    poVar3 = LogMessage::stream(&local_1a0);
    std::operator<<(poVar3,"Check failed: v != reinterpret_cast<char*>(-1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  LogMessage::LogMessage
            (&local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
             ,0x2e9,0);
  poVar3 = LogMessage::stream(&local_330);
  poVar3 = std::operator<<(poVar3,"Memory at ");
  std::ostream::operator<<(poVar3,pvStack_10);
  LogMessage::~LogMessage(&local_330);
  iVar2 = munmap((void *)((long)pvStack_10 + local_20),local_20);
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2ea);
    poVar3 = LogMessage::stream(&local_4b0);
    poVar3 = std::operator<<(poVar3,"Check failed: (munmap(v + pagesize, pagesize)) == (0)");
    poVar3 = std::operator<<(poVar3," error ");
    piVar4 = __errno_location();
    std::ostream::operator<<(poVar3,*piVar4);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4b0);
  }
  *(undefined1 *)((local_20 - 1) + (long)pvStack_10) = 0x31;
  pagesize._4_4_ = 0;
  StringPiece::StringPiece(&local_4c0,(char *)((long)pvStack_10 + (local_20 - 1)),1);
  RE2::RE2(&local_5a0,"(.*)");
  local_5a8 = (int *)((long)&pagesize + 4);
  bVar1 = RE2::FullMatch<int*>(&local_4c0,&local_5a0,&local_5a8);
  RE2::~RE2(&local_5a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_728,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2ee);
    poVar3 = LogMessage::stream(&local_728);
    std::operator<<(poVar3,
                    "Check failed: RE2::FullMatch(StringPiece(v + pagesize - 1, 1), \"(.*)\", &x)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_728);
  }
  if (pagesize._4_4_ != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2ef);
    poVar3 = LogMessage::stream(&local_8a8);
    std::operator<<(poVar3,"Check failed: (x) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_8a8);
  }
  return;
}

Assistant:

TEST(RE2, NULTerminated) {
#if defined(_POSIX_MAPPED_FILES) && _POSIX_MAPPED_FILES > 0
  char *v;
  int x;
  long pagesize = sysconf(_SC_PAGE_SIZE);

#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
  v = static_cast<char*>(mmap(NULL, 2*pagesize, PROT_READ|PROT_WRITE,
                              MAP_ANONYMOUS|MAP_PRIVATE, -1, 0));
  CHECK(v != reinterpret_cast<char*>(-1));
  LOG(INFO) << "Memory at " << (void*)v;
  CHECK_EQ(munmap(v + pagesize, pagesize), 0) << " error " << errno;
  v[pagesize - 1] = '1';

  x = 0;
  CHECK(RE2::FullMatch(StringPiece(v + pagesize - 1, 1), "(.*)", &x));
  CHECK_EQ(x, 1);
#endif
}